

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_writer.hpp
# Opt level: O2

void __thiscall BitstreamWriter::add_bit(BitstreamWriter *this,bool bit)

{
  byte *pbVar1;
  char cVar2;
  uint in_EAX;
  undefined8 uStack_18;
  
  cVar2 = this->_bit_position;
  if (cVar2 == '\b') {
    uStack_18 = (ulong)in_EAX;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (&this->_bytes,(int *)((long)&uStack_18 + 4));
    this->_bit_position = '\0';
    cVar2 = '\0';
  }
  pbVar1 = (this->_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  *pbVar1 = *pbVar1 | bit << (7U - cVar2 & 0x1f);
  this->_bit_position = this->_bit_position + '\x01';
  return;
}

Assistant:

void add_bit(bool bit)
    {
        if(_bit_position == 8)
        {
            _bytes.emplace_back(0);
            _bit_position = 0;
        }

        uint8_t& last_byte = _bytes[_bytes.size()-1];
        uint8_t base_value = (bit) ? 1 : 0;
        last_byte |= (base_value << (7 - _bit_position));
        _bit_position += 1;
    }